

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::DummySamplerForCombinedImageHandler::handle
          (DummySamplerForCombinedImageHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  Compiler *this_00;
  uint32_t id_00;
  SPIRType *pSVar1;
  Variant *this_01;
  bool local_91;
  bool local_85;
  bool local_75;
  uint32_t local_74;
  uint32_t local_70;
  uint32_t ptr_1;
  uint32_t id_1;
  bool separate_image_1;
  SPIRType *type_2;
  uint32_t result_type_1;
  SPIRType *type_1;
  SPIRVariable *var;
  uint32_t local_40;
  uint32_t ptr;
  uint32_t id;
  bool separate_image;
  SPIRType *type;
  uint32_t result_type;
  uint32_t length_local;
  uint32_t *args_local;
  DummySamplerForCombinedImageHandler *pDStack_18;
  Op opcode_local;
  DummySamplerForCombinedImageHandler *this_local;
  
  if ((this->need_dummy_sampler & 1U) != 0) {
    return false;
  }
  type._4_4_ = length;
  _result_type = args;
  args_local._4_4_ = opcode;
  pDStack_18 = this;
  if (opcode == OpLoad) {
    if (length < 3) {
      return false;
    }
    type._0_4_ = *args;
    _id = get<spirv_cross::SPIRType>(this->compiler,(uint32_t)type);
    local_85 = false;
    if ((*(int *)&(_id->super_IVariant).field_0xc == 0x10) &&
       (local_85 = false, (_id->image).sampled == 1)) {
      local_85 = (_id->image).dim != DimBuffer;
    }
    ptr._3_1_ = local_85;
    if (local_85 == false) {
      return true;
    }
    local_40 = _result_type[1];
    var._4_4_ = _result_type[2];
    var._3_1_ = 1;
    set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (this->compiler,local_40,(char (*) [1])0x5df766,(uint *)&type,(bool *)((long)&var + 3)
              );
    register_read(this->compiler,local_40,var._4_4_,true);
  }
  else if (opcode - OpAccessChain < 3) {
    if (length < 3) {
      return false;
    }
    type_2._4_4_ = *args;
    _id_1 = get<spirv_cross::SPIRType>(this->compiler,type_2._4_4_);
    local_91 = false;
    if ((*(int *)&(_id_1->super_IVariant).field_0xc == 0x10) &&
       (local_91 = false, (_id_1->image).sampled == 1)) {
      local_91 = (_id_1->image).dim != DimBuffer;
    }
    ptr_1._3_1_ = local_91;
    if (local_91 == false) {
      return true;
    }
    local_70 = _result_type[1];
    local_74 = _result_type[2];
    local_75 = true;
    set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
              (this->compiler,local_70,(char (*) [1])0x5df766,(uint *)((long)&type_2 + 4),&local_75)
    ;
    register_read(this->compiler,local_70,local_74,true);
    this_01 = VectorView<spirv_cross::Variant>::operator[]
                        (&(this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>,
                         (ulong)local_70);
    Variant::set_allow_type_rewrite(this_01);
  }
  else if ((((opcode == OpImageFetch) || (opcode - OpImageQuerySizeLod < 2)) ||
           (opcode - OpImageQueryLevels < 2)) &&
          (type_1 = (SPIRType *)maybe_get_backing_variable(this->compiler,args[2]),
          type_1 != (SPIRType *)0x0)) {
    this_00 = this->compiler;
    id_00 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_1->super_IVariant).field_0xc);
    pSVar1 = get<spirv_cross::SPIRType>(this_00,id_00);
    if (((*(int *)&(pSVar1->super_IVariant).field_0xc == 0x10) && ((pSVar1->image).sampled == 1)) &&
       ((pSVar1->image).dim != DimBuffer)) {
      this->need_dummy_sampler = true;
    }
  }
  return true;
}

Assistant:

bool Compiler::DummySamplerForCombinedImageHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	if (need_dummy_sampler)
	{
		// No need to traverse further, we know the result.
		return false;
	}

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image =
		    type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer;

		// If not separate image, don't bother.
		if (!separate_image)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		break;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching or querying LOD from a plain OpTypeImage, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (var)
		{
			auto &type = compiler.get<SPIRType>(var->basetype);
			if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
				need_dummy_sampler = true;
		}

		break;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];
		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image =
		    type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer;
		if (!separate_image)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);

		// Other backends might use SPIRAccessChain for this later.
		compiler.ir.ids[id].set_allow_type_rewrite();
		break;
	}

	default:
		break;
	}

	return true;
}